

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O3

vector<duckdb::CatalogSearchEntry,_true> *
duckdb::GetCatalogEntries
          (vector<duckdb::CatalogSearchEntry,_true> *__return_storage_ptr__,
          CatalogEntryRetriever *retriever,string *catalog,string *schema)

{
  ClientContext *context;
  bool bVar1;
  CatalogSearchPath *this;
  const_reference str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *schema_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *catalog_name;
  optional_ptr<duckdb::Catalog,_true> catalog_entry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  catalogs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  schemas;
  optional_ptr<duckdb::Catalog,_true> local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  context = retriever->context;
  (__return_storage_ptr__->
  super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = CatalogEntryRetriever::GetSearchPath(retriever);
  bVar1 = IsInvalidCatalog((string *)catalog);
  if ((bVar1) && (bVar1 = IsInvalidSchema((string *)schema), bVar1)) {
    ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
    operator=(&__return_storage_ptr__->
               super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
              ,&(this->paths).
                super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             );
    return __return_storage_ptr__;
  }
  bVar1 = IsInvalidCatalog((string *)catalog);
  if (bVar1) {
    CatalogSearchPath::GetCatalogsForSchema
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)&local_68,this,schema);
    for (; local_68._M_allocated_capacity != local_68._8_8_;
        local_68._M_allocated_capacity = local_68._M_allocated_capacity + 0x20) {
      ::std::vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>>::
      emplace_back<std::__cxx11::string&,std::__cxx11::string_const&>
                ((vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_68._M_allocated_capacity,schema);
    }
    if ((__return_storage_ptr__->
        super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->
        super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      str = vector<duckdb::CatalogSearchEntry,_true>::operator[](&this->paths,1);
      bVar1 = IsInvalidCatalog((string *)str);
      if (bVar1) {
        str = (const_reference)DatabaseManager::GetDefaultDatabase_abi_cxx11_(context);
      }
      ::std::vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>>::
      emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>> *)
                 __return_storage_ptr__,&str->catalog,schema);
    }
    this_00 = &local_68;
  }
  else {
    bVar1 = IsInvalidSchema((string *)schema);
    if (!bVar1) {
      ::std::vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>>::
      emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>> *)
                 __return_storage_ptr__,catalog,schema);
      return __return_storage_ptr__;
    }
    CatalogSearchPath::GetSchemasForCatalog
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)&local_48,this,catalog);
    for (; local_48._M_allocated_capacity != local_48._8_8_;
        local_48._M_allocated_capacity = local_48._M_allocated_capacity + 0x20) {
      ::std::vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>>::
      emplace_back<std::__cxx11::string_const&,std::__cxx11::string&>
                ((vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>> *)
                 __return_storage_ptr__,catalog,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_48._M_allocated_capacity);
    }
    if ((__return_storage_ptr__->
        super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->
        super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_70 = Catalog::GetCatalogEntry(context,catalog);
      if (local_70.ptr == (Catalog *)0x0) {
        ::std::vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>>::
        emplace_back<std::__cxx11::string_const&,char_const(&)[5]>
                  ((vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>> *)
                   __return_storage_ptr__,catalog,(char (*) [5])0x1edb74b);
      }
      else {
        optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_70);
        (*(local_70.ptr)->_vptr_Catalog[0x19])(&local_68);
        ::std::vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>>::
        emplace_back<std::__cxx11::string_const&,std::__cxx11::string>
                  ((vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>> *)
                   __return_storage_ptr__,catalog,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_allocated_capacity != &local_58) {
          operator_delete((void *)local_68._M_allocated_capacity);
        }
      }
    }
    this_00 = &local_48;
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00->_M_local_buf);
  return __return_storage_ptr__;
}

Assistant:

vector<CatalogSearchEntry> GetCatalogEntries(CatalogEntryRetriever &retriever, const string &catalog,
                                             const string &schema) {
	auto &context = retriever.GetContext();
	vector<CatalogSearchEntry> entries;
	auto &search_path = retriever.GetSearchPath();
	if (IsInvalidCatalog(catalog) && IsInvalidSchema(schema)) {
		// no catalog or schema provided - scan the entire search path
		entries = search_path.Get();
	} else if (IsInvalidCatalog(catalog)) {
		auto catalogs = search_path.GetCatalogsForSchema(schema);
		for (auto &catalog_name : catalogs) {
			entries.emplace_back(catalog_name, schema);
		}
		if (entries.empty()) {
			auto &default_entry = search_path.GetDefault();
			if (!IsInvalidCatalog(default_entry.catalog)) {
				entries.emplace_back(default_entry.catalog, schema);
			} else {
				entries.emplace_back(DatabaseManager::GetDefaultDatabase(context), schema);
			}
		}
	} else if (IsInvalidSchema(schema)) {
		auto schemas = search_path.GetSchemasForCatalog(catalog);
		for (auto &schema_name : schemas) {
			entries.emplace_back(catalog, schema_name);
		}
		if (entries.empty()) {
			auto catalog_entry = Catalog::GetCatalogEntry(context, catalog);
			if (catalog_entry) {
				entries.emplace_back(catalog, catalog_entry->GetDefaultSchema());
			} else {
				entries.emplace_back(catalog, DEFAULT_SCHEMA);
			}
		}
	} else {
		// specific catalog and schema provided
		entries.emplace_back(catalog, schema);
	}
	return entries;
}